

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<std::multiplies<float>>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_11;
  int i_10;
  float b0_6;
  int x_3;
  float a0_5;
  int y_3;
  float *outptr_9;
  float *ptr1_5;
  int i_9;
  float *outptr_8;
  float *ptr1_4;
  float a0_4;
  int q_7;
  int i_8;
  float a0_3;
  int i_7;
  float a0_2;
  int i_6;
  float *outptr_7;
  float *ptr1_3;
  int q_6;
  float a0_1;
  int x_2;
  float b0_5;
  int y_2;
  float *outptr_6;
  float *ptr_6;
  int i_5;
  float b0_4;
  int i_4;
  int x_1;
  float a0;
  int y_1;
  float *outptr_5;
  float *ptr1_2;
  float *ptr_5;
  int q_5;
  int i_3;
  float *outptr_4;
  float b0_3;
  float *ptr_4;
  int q_4;
  int i_2;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  float b0_2;
  int x;
  float b0_1;
  int y;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  int i_1;
  float *outptr_1;
  float *ptr1;
  float *ptr_1;
  int q_1;
  int i;
  float *b0;
  float *outptr;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  multiplies<float> op;
  Mat *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  size_t in_stack_fffffffffffff900;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffff908;
  int _w;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  int local_650;
  int local_64c;
  float local_648;
  int local_644;
  float local_640;
  int local_63c;
  float *local_638;
  float *local_630;
  int local_624;
  Mat local_620;
  float *local_5e0;
  Mat local_5d8;
  float *local_598;
  float local_58c;
  int local_588;
  int local_584;
  float local_580;
  int local_57c;
  float local_578;
  int local_574;
  Mat local_570;
  float *local_530;
  Mat local_528;
  float *local_4e8;
  int local_4dc;
  float local_4d8;
  int local_4d4;
  float local_4d0;
  int local_4cc;
  float *local_4c8;
  float *local_4c0;
  int local_4b8;
  float local_4b4;
  int local_4b0;
  int local_4ac;
  float local_4a8;
  int local_4a4;
  Mat local_4a0;
  float *local_460;
  Mat local_458;
  float *local_418;
  float *local_410;
  int local_408;
  int local_404;
  Mat local_400;
  float *local_3c0;
  float local_3b4;
  Mat local_3b0;
  float *local_370;
  int local_368;
  int local_364;
  Mat local_360;
  float *local_320;
  Mat local_318;
  float *local_2d8;
  int local_2cc;
  float local_2c8;
  int local_2c4;
  float local_2c0;
  int local_2bc;
  Mat local_2b8;
  float *local_278;
  float *local_270;
  Mat local_268;
  float *local_228;
  int local_220;
  int local_21c;
  Mat local_218;
  float *local_1d8;
  Mat local_1d0;
  float *local_190;
  Mat local_188;
  float *local_148;
  int local_140;
  int local_13c;
  Mat local_138;
  float *local_f8;
  Mat local_f0;
  float *local_b0;
  Mat local_a8;
  float *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  multiplies<float> local_29 [9];
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_30 = in_RDI->w;
  local_34 = in_RDI->h;
  local_38 = in_RDI->c;
  local_3c = local_30 * local_34;
  local_48 = in_RDI->elemsize;
  local_4c = in_RSI->w;
  local_50 = in_RSI->h;
  local_54 = in_RSI->c;
  local_58 = local_4c * local_50;
  _c = (int)(in_stack_fffffffffffff900 >> 0x20);
  _h = (int)in_stack_fffffffffffff908;
  _w = (int)((ulong)in_stack_fffffffffffff908 >> 0x20);
  local_18 = in_RSI;
  if (in_RDI->dims == 3) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,_h,_c,
                CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                (Allocator *)in_stack_fffffffffffff8f0);
    bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 3) {
      if ((local_18->w == 1) && (local_18->h == 1)) {
        for (local_5c = 0; local_5c < local_38; local_5c = local_5c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_a8);
          Mat::~Mat((Mat *)0x15fc31);
          local_68 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_f0);
          Mat::~Mat((Mat *)0x15fc7f);
          local_b0 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_138);
          Mat::~Mat((Mat *)0x15fccd);
          local_f8 = pfVar2;
          for (local_13c = 0; local_13c < local_3c; local_13c = local_13c + 1) {
            fVar4 = std::multiplies<float>::operator()(local_29,local_68 + local_13c,local_f8);
            local_b0[local_13c] = fVar4;
          }
        }
        return 0;
      }
      for (local_140 = 0; local_140 < local_38; local_140 = local_140 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_188);
        Mat::~Mat((Mat *)0x15fdd1);
        local_148 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_1d0);
        Mat::~Mat((Mat *)0x15fe1f);
        local_190 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_218);
        Mat::~Mat((Mat *)0x15fe6d);
        local_1d8 = pfVar2;
        for (local_21c = 0; local_21c < local_3c; local_21c = local_21c + 1) {
          fVar4 = std::multiplies<float>::operator()
                            (local_29,local_148 + local_21c,local_190 + local_21c);
          local_1d8[local_21c] = fVar4;
        }
      }
      return 0;
    }
    if (local_18->dims == 2) {
      for (local_220 = 0; local_220 < local_38; local_220 = local_220 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_268);
        Mat::~Mat((Mat *)0x15ff92);
        local_228 = pfVar2;
        local_270 = Mat::operator_cast_to_float_(local_18);
        local_270 = local_270 + local_34 * local_220;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2b8);
        Mat::~Mat((Mat *)0x16000e);
        local_278 = pfVar2;
        for (local_2bc = 0; local_2bc < local_34; local_2bc = local_2bc + 1) {
          local_2c0 = local_270[local_2bc];
          for (local_2c4 = 0; local_2c4 < local_30; local_2c4 = local_2c4 + 1) {
            fVar4 = std::multiplies<float>::operator()(local_29,local_228 + local_2c4,&local_2c0);
            local_278[local_2c4] = fVar4;
          }
          local_228 = local_228 + local_30;
          local_278 = local_278 + local_30;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_2c8 = *pfVar2;
        for (local_2cc = 0; local_2cc < local_38; local_2cc = local_2cc + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_318);
          Mat::~Mat((Mat *)0x1601e4);
          local_2d8 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_360);
          Mat::~Mat((Mat *)0x16022f);
          local_320 = pfVar2;
          for (local_364 = 0; local_364 < local_3c; local_364 = local_364 + 1) {
            fVar4 = std::multiplies<float>::operator()(local_29,local_2d8 + local_364,&local_2c8);
            local_320[local_364] = fVar4;
          }
        }
        return 0;
      }
      for (local_368 = 0; local_368 < local_38; local_368 = local_368 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_3b0);
        Mat::~Mat((Mat *)0x160330);
        local_370 = pfVar2;
        pfVar2 = Mat::operator[](local_18,local_368);
        local_3b4 = *pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_400);
        Mat::~Mat((Mat *)0x160399);
        local_3c0 = pfVar2;
        for (local_404 = 0; local_404 < local_3c; local_404 = local_404 + 1) {
          fVar4 = std::multiplies<float>::operator()(local_29,local_370 + local_404,&local_3b4);
          local_3c0[local_404] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                    (Allocator *)in_stack_fffffffffffff8f0);
        bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
        if (!bVar1) {
          for (local_408 = 0; local_408 < local_54; local_408 = local_408 + 1) {
            local_410 = Mat::operator_cast_to_float_(local_10);
            local_410 = local_410 + local_50 * local_408;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                         (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_458);
            Mat::~Mat((Mat *)0x160547);
            local_418 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                         (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_4a0);
            Mat::~Mat((Mat *)0x16058f);
            local_460 = pfVar2;
            for (local_4a4 = 0; local_4a4 < local_50; local_4a4 = local_4a4 + 1) {
              local_4a8 = local_410[local_4a4];
              for (local_4ac = 0; local_4ac < local_4c; local_4ac = local_4ac + 1) {
                fVar4 = std::multiplies<float>::operator()
                                  (local_29,&local_4a8,local_418 + local_4ac);
                local_460[local_4ac] = fVar4;
              }
              local_418 = local_418 + local_4c;
              local_460 = local_460 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,_h,
                  in_stack_fffffffffffff900,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_4b0 = 0; local_4b0 < local_3c; local_4b0 = local_4b0 + 1) {
          pfVar2 = Mat::operator[](local_10,local_4b0);
          pfVar3 = Mat::operator[](local_18,local_4b0);
          fVar4 = std::multiplies<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_4b0);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                    (int)((ulong)in_stack_fffffffffffff908 >> 0x20),(int)in_stack_fffffffffffff908,
                    in_stack_fffffffffffff900,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_4b4 = *pfVar2;
          for (local_4b8 = 0; local_4b8 < local_3c; local_4b8 = local_4b8 + 1) {
            pfVar2 = Mat::operator[](local_10,local_4b8);
            fVar4 = std::multiplies<float>::operator()(local_29,pfVar2,&local_4b4);
            pfVar2 = Mat::operator[](local_20,local_4b8);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_4c0 = Mat::operator_cast_to_float_(local_10);
        local_4c8 = Mat::operator_cast_to_float_(local_20);
        for (local_4cc = 0; local_4cc < local_34; local_4cc = local_4cc + 1) {
          pfVar2 = Mat::operator[](local_18,local_4cc);
          local_4d0 = *pfVar2;
          for (local_4d4 = 0; local_4d4 < local_30; local_4d4 = local_4d4 + 1) {
            fVar4 = std::multiplies<float>::operator()(local_29,local_4c0 + local_4d4,&local_4d0);
            local_4c8[local_4d4] = fVar4;
          }
          local_4c0 = local_4c0 + local_30;
          local_4c8 = local_4c8 + local_30;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                      (Allocator *)in_stack_fffffffffffff8f0);
          bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_4d8 = *pfVar2;
            for (local_4dc = 0; local_4dc < local_54; local_4dc = local_4dc + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                           (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_528);
              Mat::~Mat((Mat *)0x160b3e);
              local_4e8 = pfVar2;
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                           (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_570);
              Mat::~Mat((Mat *)0x160b86);
              local_530 = pfVar2;
              for (local_574 = 0; local_574 < local_58; local_574 = local_574 + 1) {
                fVar4 = std::multiplies<float>::operator()
                                  (local_29,&local_4d8,local_4e8 + local_574);
                local_530[local_574] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,_h,
                      in_stack_fffffffffffff900,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
          bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_578 = *pfVar2;
            for (local_57c = 0; local_57c < local_58; local_57c = local_57c + 1) {
              pfVar2 = Mat::operator[](local_18,local_57c);
              fVar4 = std::multiplies<float>::operator()(local_29,&local_578,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_57c);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,
                      in_stack_fffffffffffff900,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
          bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_580 = *pfVar2;
            for (local_584 = 0; local_584 < local_58; local_584 = local_584 + 1) {
              pfVar2 = Mat::operator[](local_18,local_584);
              fVar4 = std::multiplies<float>::operator()(local_29,&local_580,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_584);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                    (Allocator *)in_stack_fffffffffffff8f0);
        bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
        if (!bVar1) {
          for (local_588 = 0; local_588 < local_54; local_588 = local_588 + 1) {
            pfVar2 = Mat::operator[](local_10,local_588);
            local_58c = *pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                         (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_5d8);
            Mat::~Mat((Mat *)0x160f27);
            local_598 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                         (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_620);
            Mat::~Mat((Mat *)0x160f6f);
            local_5e0 = pfVar2;
            for (local_624 = 0; local_624 < local_58; local_624 = local_624 + 1) {
              fVar4 = std::multiplies<float>::operator()(local_29,&local_58c,local_598 + local_624);
              local_5e0[local_624] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,_h,
                    in_stack_fffffffffffff900,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
        if (!bVar1) {
          local_630 = Mat::operator_cast_to_float_(local_18);
          local_638 = Mat::operator_cast_to_float_(local_20);
          for (local_63c = 0; local_63c < local_50; local_63c = local_63c + 1) {
            pfVar2 = Mat::operator[](local_10,local_63c);
            local_640 = *pfVar2;
            for (local_644 = 0; local_644 < local_4c; local_644 = local_644 + 1) {
              fVar4 = std::multiplies<float>::operator()(local_29,&local_640,local_630 + local_644);
              local_638[local_644] = fVar4;
            }
            local_630 = local_630 + local_4c;
            local_638 = local_638 + local_4c;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),_w,
                    in_stack_fffffffffffff900,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_648 = *pfVar2;
          for (local_64c = 0; local_64c < local_3c; local_64c = local_64c + 1) {
            pfVar2 = Mat::operator[](local_10,local_64c);
            fVar4 = std::multiplies<float>::operator()(local_29,pfVar2,&local_648);
            pfVar2 = Mat::operator[](local_20,local_64c);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_650 = 0; local_650 < local_3c; local_650 = local_650 + 1) {
          pfVar2 = Mat::operator[](local_10,local_650);
          pfVar3 = Mat::operator[](local_18,local_650);
          fVar4 = std::multiplies<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_650);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;
    size_t elemsize = a.elemsize;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        c.create(w, h, channels, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 3)
        {
            if (b.w == 1&&b.h==1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);
                    const float* b0 = b.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0[0]);
                    }
                }

                return 0;
             }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = (const float*)b + h * q;
                float* outptr = c.channel(q);

                for (int y=0; y<h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x=0; x<w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                const float b0 = b[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float* ptr = (const float*)a + h1 * q;
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x=0; x<w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            const float* ptr = a;
            float* outptr = c;

            for (int y=0; y<h; y++)
            {
                const float b0 = b[y];
                for (int x=0; x<w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                c.create(w1, h1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                c.create(w1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            c.create(w1, h1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y=0; y<h1; y++)
            {
                const float a0 = a[y];
                for (int x=0; x<w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}